

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

floatx80 int32_to_floatx80_aarch64(int32_t a,float_status *status)

{
  byte bVar1;
  int iVar2;
  floatx80 fVar3;
  uint32_t local_44;
  uint64_t zSig;
  int8_t shiftCount;
  uint32_t absA;
  flag zSign;
  float_status *status_local;
  uint64_t uStack_18;
  int32_t a_local;
  uint16_t local_10;
  
  if (a == 0) {
    fVar3 = packFloatx80('\0',0,0);
    local_10 = fVar3.high;
  }
  else {
    local_44 = a;
    if (a < 0) {
      local_44 = -a;
    }
    iVar2 = clz32(local_44);
    bVar1 = (char)iVar2 + 0x20;
    fVar3 = packFloatx80(a < 0,0x403e - (char)bVar1,(ulong)local_44 << (bVar1 & 0x3f));
    local_10 = fVar3.high;
  }
  uStack_18 = fVar3.low;
  fVar3.high = local_10;
  fVar3.low = uStack_18;
  return fVar3;
}

Assistant:

floatx80 int32_to_floatx80(int32_t a, float_status *status)
{
    flag zSign;
    uint32_t absA;
    int8_t shiftCount;
    uint64_t zSig;

    if ( a == 0 ) return packFloatx80( 0, 0, 0 );
    zSign = ( a < 0 );
    absA = zSign ? - a : a;
    shiftCount = clz32(absA) + 32;
    zSig = absA;
    return packFloatx80( zSign, 0x403E - shiftCount, zSig<<shiftCount );

}